

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_SerializingToString_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_SerializingToString_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  key_type kVar4;
  key_type kVar5;
  key_type kVar6;
  value_type vVar7;
  key_type kVar8;
  Type type;
  AssertHelper *this_00;
  char *message;
  AssertionResult *this_01;
  long in_RDI;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  TypeParam ht_in;
  AssertionResult gtest_ar_;
  StringIO stringio;
  string stringbuf;
  int i;
  TypeParam ht_out;
  undefined4 in_stack_fffffffffffffb28;
  int in_stack_fffffffffffffb2c;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  allocator_type *in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb48;
  int in_stack_fffffffffffffb4c;
  hasher *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb58;
  Type in_stack_fffffffffffffb5c;
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb90;
  undefined2 in_stack_fffffffffffffb94;
  undefined1 in_stack_fffffffffffffb96;
  string *s;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  value_type in_stack_fffffffffffffbac;
  uint i_00;
  string local_420 [48];
  key_type local_3f0;
  undefined1 local_3e9;
  AssertionResult local_3e8;
  string local_3d8 [48];
  key_type local_3a8;
  undefined1 local_3a1;
  AssertionResult local_3a0 [2];
  key_type local_37c;
  dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_378;
  Type local_354;
  AssertionResult local_350;
  string local_340 [48];
  key_type local_310;
  undefined1 local_309;
  AssertionResult local_308 [2];
  key_type local_2e4;
  dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_2e0;
  value_type local_2bc;
  AssertionResult local_2b8 [2];
  key_type local_294;
  dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_290;
  value_type local_26c;
  AssertionResult local_268;
  string local_258 [55];
  undefined1 local_221;
  AssertionResult local_220;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_210;
  Hasher local_200;
  Hasher local_1f4;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_1e8;
  string local_168 [55];
  undefined1 local_131;
  AssertionResult local_130;
  StringIO local_120;
  string local_118;
  key_type local_f8;
  key_type local_f4;
  value_type local_c8;
  int local_c4;
  key_type local_c0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b0;
  Hasher local_a0;
  Hasher local_94;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_88;
  
  bVar1 = google::
          HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    i_00 = 0;
    Hasher::Hasher(&local_94,0);
    Hasher::Hasher(&local_a0,i_00);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_b0,i_00,(int *)(ulong)i_00);
    google::
    HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashSet
              (in_stack_fffffffffffffb60,
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               in_stack_fffffffffffffb50,
               (key_equal *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               in_stack_fffffffffffffb40);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_b0);
    kVar4 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
    local_c0 = kVar4;
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffb30,
                      (key_type *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    for (local_c4 = 1; local_c4 < 100; local_c4 = local_c4 + 1) {
      in_stack_fffffffffffffbac =
           HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
      local_c8 = in_stack_fffffffffffffbac;
      google::
      BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)CONCAT44(i_00,kVar4),
               (value_type *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    }
    kVar5 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
    local_f4 = kVar5;
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffffb30,
            (key_type *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    kVar6 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
    local_f8 = kVar6;
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffffb30,
            (key_type *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    s = &local_118;
    std::__cxx11::string::string((string *)s);
    StringIO::StringIO(&local_120,s);
    uVar2 = google::
            BaseHashtableInterface<google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::serialize<google::sparsehash_internal::pod_serializer<int>,StringIO>
                      (&local_88,&local_120);
    local_131 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb30,
               (bool *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (type *)0xf7cfd5);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbac,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffba0),(char *)s,
                 (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffb96,
                                                 CONCAT24(in_stack_fffffffffffffb94,
                                                          in_stack_fffffffffffffb90))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
                 (char *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                 (char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      std::__cxx11::string::~string(local_168);
      testing::Message::~Message((Message *)0xf7d0b1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf7d148);
    Hasher::Hasher(&local_1f4,0);
    Hasher::Hasher(&local_200,0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_210,0,(int *)0x0);
    google::
    HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashSet
              (in_stack_fffffffffffffb60,
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               in_stack_fffffffffffffb50,
               (key_equal *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               in_stack_fffffffffffffb40);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_210);
    uVar3 = google::
            BaseHashtableInterface<google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::unserialize<google::sparsehash_internal::pod_serializer<int>,StringIO>
                      (&local_1e8,&local_120);
    local_221 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb30,
               (bool *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (type *)0xf7d1f6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_220);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbac,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffba0),(char *)s,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffb94,
                                                                in_stack_fffffffffffffb90))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
                 (char *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                 (char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      std::__cxx11::string::~string(local_258);
      testing::Message::~Message((Message *)0xf7d30a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf7d3a1);
    vVar7 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
    local_26c = vVar7;
    local_294 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffb70,
           (key_type *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    google::
    dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_290);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               (char *)in_stack_fffffffffffffb40,
               (int *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
               (int *)in_stack_fffffffffffffb30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_268);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::AssertionResult::failure_message((AssertionResult *)0xf7d481);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
                 (char *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                 (char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0xf7d4de);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf7d54f);
    local_2bc = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
    local_2e4 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffb70,
           (key_type *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    google::
    dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_2e0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               (char *)in_stack_fffffffffffffb40,
               (int *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
               (int *)in_stack_fffffffffffffb30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffb70 =
           (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xf7d62f);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
                 (char *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                 (char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0xf7d68c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf7d6fd);
    kVar8 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
    local_310 = kVar8;
    this_00 = (AssertHelper *)
              google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffb30,
                      (key_type *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    local_309 = this_00 == (AssertHelper *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb30,
               (bool *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (type *)0xf7d765);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_308);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbac,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffba0),(char *)s,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffb94,vVar7))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,in_stack_fffffffffffffb5c,(char *)in_stack_fffffffffffffb50,
                 in_stack_fffffffffffffb4c,(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      std::__cxx11::string::~string(local_340);
      testing::Message::~Message((Message *)0xf7d83a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf7d8d1);
    type = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
    local_354 = type;
    local_37c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffb70,(key_type *)CONCAT44(kVar8,in_stack_fffffffffffffb68));
    google::
    dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_378);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               (char *)in_stack_fffffffffffffb40,
               (int *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
               (int *)in_stack_fffffffffffffb30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_350);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffb50 =
           (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0xf7d9b1);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                 (char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0xf7da0e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf7da7f);
    kVar8 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
    local_3a8 = kVar8;
    message = (char *)google::
                      BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)in_stack_fffffffffffffb30,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    local_3a1 = message == (char *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb30,
               (bool *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (type *)0xf7dae7);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3a0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbac,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffba0),(char *)s,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffb94,vVar7))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffffb50,kVar8,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      std::__cxx11::string::~string(local_3d8);
      testing::Message::~Message((Message *)0xf7dbbc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf7dc53);
    local_3f0 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
    this_01 = (AssertionResult *)
              google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffb30,
                      (key_type *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    local_3e9 = this_01 == (AssertionResult *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              (this_01,(bool *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (type *)0xf7dcbb);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e8);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbac,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffba0),(char *)s,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffb94,vVar7))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffffb50,kVar8,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
      std::__cxx11::string::~string(local_420);
      testing::Message::~Message((Message *)0xf7dd90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf7de24);
    google::
    HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashSet
              ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf7de31);
    std::__cxx11::string::~string((string *)&local_118);
    google::
    HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashSet
              ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf7de4b);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, SerializingToString) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  string stringbuf;
  StringIO stringio(&stringbuf);
  EXPECT_TRUE(
      ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));

  TypeParam ht_in;
  EXPECT_TRUE(
      ht_in.unserialize(typename TypeParam::NopointerSerializer(), &stringio));

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}